

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glvnd.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint __line;
  long lVar1;
  code *pcVar2;
  long lVar3;
  char *__assertion;
  
  lVar1 = dlopen("libGLX.so.0",2);
  if (lVar1 == 0) {
    return 0x7d;
  }
  pcVar2 = (code *)dlsym(lVar1,"glXGetProcAddress");
  if (pcVar2 == (code *)0x0) {
    __assertion = "pfnglXGetProcAddress != nullptr";
    __line = 0x34;
  }
  else {
    (*pcVar2)("glClear");
    lVar3 = dlopen("libOpenGL.so.0",2);
    if (lVar3 == 0) {
      __assertion = "libOpenGL != nullptr";
      __line = 0x38;
    }
    else {
      pcVar2 = (code *)dlsym(lVar3,"glClearColor");
      if (pcVar2 != (code *)0x0) {
        (*pcVar2)(0x3e800000,0x3f000000,0x3f400000,0x3f800000);
        dlclose(lVar3);
        dlclose(lVar1);
        return 0;
      }
      __assertion = "pfnClearColor !=0";
      __line = 0x3c;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/apitrace[P]apitrace-tests/apps/gl/glvnd.cpp"
                ,__line,"int main(int, char **)");
}

Assistant:

int
main(int argc, char **argv)
{
    void *libGLX = dlopen("libGLX.so.0", RTLD_NOW | RTLD_LOCAL);
    if (libGLX == nullptr) {
        return EXIT_SKIP;
    }

    PFNGLXGETPROCADDRESSPROC pfnglXGetProcAddress = (PFNGLXGETPROCADDRESSPROC)dlsym(libGLX, "glXGetProcAddress");
    assert(pfnglXGetProcAddress != nullptr);
    pfnglXGetProcAddress((const GLubyte *)"glClear");

    void *libOpenGL = dlopen("libOpenGL.so.0", RTLD_NOW | RTLD_LOCAL);
    assert(libOpenGL != nullptr);

    typedef void (APIENTRY *PFNGLCLEARCOLOR)(GLfloat, GLfloat, GLfloat, GLfloat);
    PFNGLCLEARCOLOR pfnClearColor = (PFNGLCLEARCOLOR)dlsym(libOpenGL, "glClearColor");
    assert(pfnClearColor !=0 );

    pfnClearColor(0.25, 0.5, 0.75, 1.0);

    dlclose(libOpenGL);
    dlclose(libGLX);

    return 0;
}